

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall
ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(ON_SubD_FixedSizeHeap *this,uint sector_edge_count)

{
  uint uVar1;
  undefined4 local_3c;
  uint p_capacity;
  uint f_capacity;
  uint v_capacity;
  uint k;
  uint sector_edge_count_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if (sector_edge_count == 0) {
    Destroy(this);
    this_local._7_1_ = true;
  }
  else {
    if (sector_edge_count < 5) {
      local_3c = 0;
    }
    else {
      local_3c = sector_edge_count - 4;
    }
    uVar1 = local_3c * 2 + 0x10;
    this_local._7_1_ =
         Internal_ReserveSubDWorkspace
                   (this,(ulong)uVar1,(ulong)(local_3c + 9),(ulong)(uVar1 * 8 + local_3c * 2),false)
    ;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(
  unsigned int sector_edge_count
  )
{
  if (0 == sector_edge_count)
  {
    Destroy();
    return true;
  }

  const unsigned int k = (sector_edge_count <= 4) ? 0 : (sector_edge_count - 4);
  const unsigned int v_capacity = 16 + 2 * k;
  const unsigned int f_capacity = 9 + k;
  const unsigned int p_capacity = 8*v_capacity + 2 * k;

  return Internal_ReserveSubDWorkspace(v_capacity, f_capacity, p_capacity, false);
}